

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

Nonnull<char_*>
absl::lts_20250127::numbers_internal::FastIntToBuffer(int32_t i,Nonnull<char_*> buffer)

{
  uint uVar1;
  uint64_t uVar2;
  uint local_54;
  Nonnull<char_*> pcStack_50;
  uint32_t u;
  Nonnull<char_*> buffer_local;
  int32_t i_local;
  uint64_t bottom;
  uint32_t mod08;
  uint32_t div08;
  uint32_t zeroes;
  uint64_t bottom_1;
  char *local_10;
  
  local_54 = i;
  pcStack_50 = buffer;
  if (i < 0) {
    pcStack_50 = buffer + 1;
    *buffer = '-';
    local_54 = -i;
  }
  if (local_54 < 10) {
    *pcStack_50 = (char)local_54 + '0';
    local_10 = pcStack_50 + 1;
  }
  else if (local_54 < 100000000) {
    uVar2 = anon_unknown_0::PrepareEightDigits(local_54);
    if (uVar2 == 0) {
      __assert_fail("bottom != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                    ,0xf5,
                    "absl::Nonnull<char *> absl::lts_20250127::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                   );
    }
    uVar1 = countr_zero<unsigned_long>(uVar2);
    little_endian::Store64(pcStack_50,uVar2 + 0x3030303030303030 >> ((byte)uVar1 & 0x38));
    local_10 = pcStack_50 + (8 - (ulong)(uVar1 >> 3));
  }
  else {
    uVar2 = anon_unknown_0::PrepareEightDigits(local_54 % 100000000);
    local_10 = anon_unknown_0::EncodeHundred(local_54 / 100000000,pcStack_50);
    little_endian::Store64(local_10,uVar2 + 0x3030303030303030);
    local_10 = local_10 + 8;
  }
  *local_10 = '\0';
  return local_10;
}

Assistant:

absl::Nonnull<char*> numbers_internal::FastIntToBuffer(
    int32_t i, absl::Nonnull<char*> buffer) {
  uint32_t u = static_cast<uint32_t>(i);
  if (i < 0) {
    *buffer++ = '-';
    // We need to do the negation in modular (i.e., "unsigned")
    // arithmetic; MSVC++ apparently warns for plain "-u", so
    // we write the equivalent expression "0 - u" instead.
    u = 0 - u;
  }
  buffer = EncodeFullU32(u, buffer);
  *buffer = '\0';
  return buffer;
}